

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QByteArray>_>::rehash
          (Data<QHashPrivate::Node<int,_QByteArray>_> *this,size_t sizeHint)

{
  ulong uVar1;
  long lVar2;
  Data *pDVar3;
  char *pcVar4;
  qsizetype qVar5;
  long lVar6;
  ulong uVar7;
  Node<int,_QByteArray> *pNVar8;
  ulong uVar9;
  size_t index;
  long lVar10;
  long lVar11;
  size_t numBuckets;
  Span<QHashPrivate::Node<int,_QByteArray>_> *this_00;
  long lVar12;
  R_conflict8 RVar13;
  Bucket BVar14;
  
  if (sizeHint == 0) {
    sizeHint = *(size_t *)(this + 8);
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar6 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar6 ^ 0x3f) & 0x3f);
  }
  uVar1 = *(ulong *)(this + 0x10);
  lVar6 = *(long *)(this + 0x20);
  RVar13 = allocateSpans(numBuckets);
  *(Span **)(this + 0x20) = RVar13.spans;
  *(size_t *)(this + 0x10) = numBuckets;
  if (0x7f < uVar1) {
    uVar9 = 0;
    lVar12 = lVar6;
    do {
      this_00 = (Span<QHashPrivate::Node<int,_QByteArray>_> *)(uVar9 * 0x90 + lVar6);
      lVar10 = 0;
      do {
        if (*(byte *)(lVar12 + lVar10) != 0xff) {
          lVar2 = *(long *)(this_00 + 0x80);
          lVar11 = (ulong)*(byte *)(lVar12 + lVar10) * 0x20;
          uVar7 = (long)*(int *)(lVar2 + lVar11) ^ *(ulong *)(this + 0x18);
          uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
          uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
          BVar14 = findBucketWithHash<int>(this,(int *)(lVar2 + lVar11),uVar7 >> 0x20 ^ uVar7);
          pNVar8 = Span<QHashPrivate::Node<int,_QByteArray>_>::insert
                             ((Span<QHashPrivate::Node<int,_QByteArray>_> *)BVar14.span,BVar14.index
                             );
          pNVar8->key = *(int *)(lVar2 + lVar11);
          pDVar3 = *(Data **)(lVar2 + 8 + lVar11);
          *(undefined8 *)(lVar2 + 8 + lVar11) = 0;
          (pNVar8->value).d.d = pDVar3;
          pcVar4 = *(char **)(lVar2 + 0x10 + lVar11);
          *(undefined8 *)(lVar2 + 0x10 + lVar11) = 0;
          (pNVar8->value).d.ptr = pcVar4;
          qVar5 = *(qsizetype *)(lVar2 + 0x18 + lVar11);
          *(undefined8 *)(lVar2 + 0x18 + lVar11) = 0;
          (pNVar8->value).d.size = qVar5;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x80);
      Span<QHashPrivate::Node<int,_QByteArray>_>::freeData(this_00);
      uVar9 = uVar9 + 1;
      lVar12 = lVar12 + 0x90;
    } while (uVar9 != uVar1 >> 7);
  }
  if (lVar6 != 0) {
    lVar12 = *(long *)(lVar6 + -8);
    if (lVar12 != 0) {
      lVar10 = lVar12 * 0x90;
      do {
        Span<QHashPrivate::Node<int,_QByteArray>_>::freeData
                  ((Span<QHashPrivate::Node<int,_QByteArray>_> *)(lVar6 + -0x90 + lVar10));
        lVar10 = lVar10 + -0x90;
      } while (lVar10 != 0);
    }
    operator_delete__((void *)(lVar6 + -8),lVar12 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }